

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
external_light_sensor_message_write_read::test_method
          (external_light_sensor_message_write_read *this)

{
  size_t i;
  long lVar1;
  external_light_sensor_message write_msg;
  buffer buffer;
  buffer_writer writer;
  external_light_sensor_message read_msg;
  buffer_reader reader;
  double local_d0;
  buffer local_c8;
  buffer_writer local_b0;
  assertion_result local_a0;
  external_light_sensor_message local_88;
  buffer_reader local_80;
  const_string local_68;
  char *local_58;
  char *local_50;
  lazy_ostream local_48;
  undefined1 *local_38;
  char **local_30;
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_28;
  
  local_d0 = 0.6;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_writer::buffer_writer(&local_b0,&local_c8);
  local_48._vptr_lazy_ostream =
       (_func_int **)CONCAT35(local_48._vptr_lazy_ostream._5_3_,0x4100000000);
  local_48._vptr_lazy_ostream = (_func_int **)CONCAT44(local_48._vptr_lazy_ostream._4_4_,0xd);
  ::operator<<(&local_b0,(message_header *)&local_48);
  lVar1 = 0;
  do {
    buffer_writer::operator<<(&local_b0,*(uint8_t *)((long)&local_d0 + lVar1));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  buffer_reader::buffer_reader(&local_80,&local_c8);
  ::operator>>(&local_80,&local_88);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b4d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x186924);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 200;
  local_28.m_rhs = &local_d0;
  local_28.m_lhs.m_value = (double *)&local_88;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  ::evaluate(&local_a0,&local_28,false);
  local_30 = &local_58;
  local_58 = "read_msg.data[i] == write_msg.data[i]";
  local_50 = "";
  local_48.m_empty = false;
  local_48._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b0750;
  local_38 = boost::unit_test::lazy_ostream::inst;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_68.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_48,&local_68,200,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_light_sensor_message_write_read)
{
    external_light_sensor_message write_msg;
    for(int i = 0; i<1; i++){
      write_msg.data[i] = static_cast<double>(i) + 0.6;
    }

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_light_sensor_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<1; i++){
      BOOST_TEST(read_msg.data[i] == write_msg.data[i]);
    }
}